

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

void __thiscall
BackgroundParser::RemoveFromUnprocessedItems(BackgroundParser *this,BackgroundParseItem *item)

{
  BackgroundParseItem *pBVar1;
  BackgroundParseItem *pBVar2;
  BackgroundParseItem *item_local;
  BackgroundParser *this_local;
  
  if (this->unprocessedItemsHead == item) {
    pBVar1 = BackgroundParseItem::GetNextUnprocessedItem(item);
    this->unprocessedItemsHead = pBVar1;
  }
  else {
    pBVar1 = BackgroundParseItem::GetPrevUnprocessedItem(item);
    pBVar2 = BackgroundParseItem::GetNextUnprocessedItem(item);
    BackgroundParseItem::SetNextUnprocessedItem(pBVar1,pBVar2);
  }
  if (this->unprocessedItemsTail == item) {
    pBVar1 = BackgroundParseItem::GetPrevUnprocessedItem(item);
    this->unprocessedItemsTail = pBVar1;
  }
  else {
    pBVar1 = BackgroundParseItem::GetNextUnprocessedItem(item);
    pBVar2 = BackgroundParseItem::GetPrevUnprocessedItem(item);
    BackgroundParseItem::SetPrevUnprocessedItem(pBVar1,pBVar2);
  }
  BackgroundParseItem::SetNextUnprocessedItem(item,(BackgroundParseItem *)0x0);
  BackgroundParseItem::SetPrevUnprocessedItem(item,(BackgroundParseItem *)0x0);
  return;
}

Assistant:

void BackgroundParser::RemoveFromUnprocessedItems(BackgroundParseItem *const item)
{
    if (this->unprocessedItemsHead == item)
    {
        this->unprocessedItemsHead = item->GetNextUnprocessedItem();
    }
    else
    {
        item->GetPrevUnprocessedItem()->SetNextUnprocessedItem(item->GetNextUnprocessedItem());
    }
    if (this->unprocessedItemsTail == item)
    {
        this->unprocessedItemsTail = item->GetPrevUnprocessedItem();
    }
    else
    {
        item->GetNextUnprocessedItem()->SetPrevUnprocessedItem(item->GetPrevUnprocessedItem());
    }
    item->SetNextUnprocessedItem(nullptr);
    item->SetPrevUnprocessedItem(nullptr);
}